

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monitor.h
# Opt level: O0

void __thiscall Monitor::stop(Monitor *this)

{
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0x10) = 1;
  gettimeofday((timeval *)(in_RDI + 0x28),(__timezone_ptr_t)0x0);
  return;
}

Assistant:

inline void stop() {
		stopped = 1; // set timer stopped flag
		#ifdef _WIN32
		QueryPerformanceCounter(&endCount);
		#else
		gettimeofday(&endCount, NULL);
		#endif
	}